

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

int __thiscall
kj::
ArrayBuilder<kj::HashMap<const_capnp::_::(anonymous_namespace)::TestVat_*,_capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_*>::Entry>
::truncate(ArrayBuilder<kj::HashMap<const_capnp::_::(anonymous_namespace)::TestVat_*,_capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_*>::Entry>
           *this,char *__file,__off_t __length)

{
  char *pcVar1;
  Entry *target;
  size_t size_local;
  ArrayBuilder<kj::HashMap<const_capnp::_::(anonymous_namespace)::TestVat_*,_capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_*>::Entry>
  *this_local;
  
  pcVar1 = (char *)size(this);
  if (__file <= pcVar1) {
    this->pos = this->ptr + (long)__file;
    return (int)this;
  }
  kj::_::inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array.h"
             ,0x1b8,"size <= this->size()","\"can\'t use truncate() to expand\"",
             "can\'t use truncate() to expand");
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }